

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

bool lest::search(text *part,text *line)

{
  bool bVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58 [2];
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  undefined1 local_19;
  text *ptStack_18;
  anon_class_1_0_00000001 case_insensitive_equal;
  text *line_local;
  text *part_local;
  
  local_19 = 0;
  ptStack_18 = line;
  local_30 = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::begin(line);
  local_38 = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::end(line);
  local_40 = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::begin(part);
  local_48 = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::end(part);
  local_28 = std::
             search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,lest::search(std::__cxx11::string,std::__cxx11::string)::_lambda(char,char)_1_>
                       (local_30,local_38,local_40,local_48);
  local_58[0]._M_current =
       (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                         (line);
  bVar1 = __gnu_cxx::
          operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    (&local_28,local_58);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

inline bool search( text part, text line )
    {
        auto case_insensitive_equal = []( char a, char b )
        {
            return tolower( a ) == tolower( b );
        };

        return std::search(
            line.begin(), line.end(),
            part.begin(), part.end(), case_insensitive_equal ) != line.end();
    }